

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

void __thiscall
OptionParser::parseEnergyOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  char *pcVar1;
  char *pcVar2;
  double s1;
  bool bVar3;
  size_type sVar4;
  reference s1_00;
  string *psVar5;
  InputError *pIVar6;
  string local_1f0 [39];
  undefined1 local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  undefined1 local_179;
  string local_178 [39];
  undefined1 local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  undefined1 local_101;
  string local_100 [32];
  int local_e0;
  allocator local_d9;
  int j;
  undefined1 local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  double local_30;
  double value;
  string *tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Network *network_local;
  OptionParser *this_local;
  
  tokens = (string *)tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)network;
  network_local = (Network *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  if (2 < sVar4) {
    s1_00 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)tokens,0);
    pcVar1 = w_GLOBAL;
    value = (double)s1_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar1,&local_51);
    bVar3 = Utilities::match(s1_00,(string *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    s1 = value;
    pcVar2 = w_DEMAND;
    pcVar1 = w_PRICE;
    if (bVar3) {
      psVar5 = (string *)((long)value + 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,pcVar1,&local_89);
      bVar3 = Utilities::match(psVar5,(string *)local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      pcVar1 = w_PATTERN;
      if (bVar3) {
        bVar3 = Utilities::parseNumber<double>((string *)((long)value + 0x40),&local_30);
        if (!bVar3) {
          local_b1 = 1;
          pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_b0,(string *)((long)value + 0x40));
          InputError::InputError(pIVar6,6,(string *)local_b0);
          local_b1 = 0;
          __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
        }
        Options::setOption((Options *)(tokenList_local + 0x17),ENERGY_PRICE,local_30);
      }
      else {
        psVar5 = (string *)((long)value + 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&j,pcVar1,&local_d9);
        bVar3 = Utilities::match(psVar5,(string *)&j);
        std::__cxx11::string::~string((string *)&j);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        pcVar1 = w_EFFIC;
        if (bVar3) {
          local_e0 = Network::indexOf((Network *)tokenList_local,PATTERN,
                                      (string *)((long)value + 0x40));
          if (local_e0 < 0) {
            local_101 = 1;
            pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_100,(string *)((long)value + 0x40));
            InputError::InputError(pIVar6,5,(string *)local_100);
            local_101 = 0;
            __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
          }
          Options::setOption((Options *)(tokenList_local + 0x17),ENERGY_PRICE_PATTERN,local_e0);
        }
        else {
          psVar5 = (string *)((long)value + 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_128,pcVar1,&local_129);
          bVar3 = Utilities::match(psVar5,(string *)local_128);
          std::__cxx11::string::~string(local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
          if (!bVar3) {
            local_179 = 1;
            pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_178,(string *)((long)value + 0x20));
            InputError::InputError(pIVar6,3,(string *)local_178);
            local_179 = 0;
            __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
          }
          bVar3 = Utilities::parseNumber<double>((string *)((long)value + 0x40),&local_30);
          if (!bVar3) {
            local_151 = 1;
            pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_150,(string *)((long)value + 0x40));
            InputError::InputError(pIVar6,6,(string *)local_150);
            local_151 = 0;
            __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
          }
          Options::setOption((Options *)(tokenList_local + 0x17),PUMP_EFFICIENCY,local_30);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,pcVar2,&local_1a1);
      bVar3 = Utilities::match((string *)s1,(string *)local_1a0);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      if (!bVar3) {
        pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_1f0,(string *)value);
        InputError::InputError(pIVar6,3,(string *)local_1f0);
        __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
      }
      bVar3 = Utilities::parseNumber<double>((string *)((long)value + 0x40),&local_30);
      if (!bVar3) {
        local_1c9 = 1;
        pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_1c8,(string *)((long)value + 0x40));
        InputError::InputError(pIVar6,6,(string *)local_1c8);
        local_1c9 = 0;
        __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
      }
      Options::setOption((Options *)(tokenList_local + 0x17),PEAKING_CHARGE,local_30);
    }
  }
  return;
}

Assistant:

void OptionParser::parseEnergyOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens

    if ( tokenList.size() < 3 ) return;
    string* tokens = &tokenList[0];
    double value;

    // ... check for global energy options

    if (Utilities::match(tokens[0], w_GLOBAL))
    {
        // ... global price per kwh

        if (Utilities::match(tokens[1], w_PRICE))
        {
            if ( !Utilities::parseNumber(tokens[2], value) )
            {
                throw InputError(InputError::INVALID_NUMBER, tokens[2]);
            }
            network->options.setOption(Options::ENERGY_PRICE, value);
        }

        // ... global time of day price pattern

        else if (Utilities::match(tokens[1], w_PATTERN))
        {
            int j = network->indexOf(Element::PATTERN, tokens[2]);
            if (j < 0) throw InputError(InputError::UNDEFINED_OBJECT, tokens[2]);
            network->options.setOption(Options::ENERGY_PRICE_PATTERN, j);
        }

        // ... global pump efficiency

        else if (Utilities::match(tokens[1], w_EFFIC))
        {
            if ( !Utilities::parseNumber(tokens[2], value) )
            {
                throw InputError(InputError::INVALID_NUMBER, tokens[2]);
            }
            network->options.setOption(Options::PUMP_EFFICIENCY, value);
        }
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
    }

    // ... peak demand charge

    else if (Utilities::match(tokens[0], w_DEMAND))
    {
        if ( !Utilities::parseNumber(tokens[2], value) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
        network->options.setOption(Options::PEAKING_CHARGE, value);
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
}